

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmakebuiltins.cpp
# Opt level: O0

void addJsonValue(QJsonValue *value,QString *keyPrefix,ProValueMap *map)

{
  double dVar1;
  QLatin1StringView latin1;
  int iVar2;
  ulong uVar3;
  QJsonArray *array;
  QString *in_RSI;
  bool in_DIL;
  long in_FS_OFFSET;
  QStringBuilder<const_QString_&,_QLatin1Char> QVar4;
  QStringBuilder<const_QString_&,_QLatin1Char> *in_stack_fffffffffffffe68;
  QList<QString> *in_stack_fffffffffffffe70;
  QString *in_stack_fffffffffffffe78;
  QString *a;
  QLatin1String *in_stack_fffffffffffffe80;
  QStringList *in_stack_fffffffffffffe88;
  QString *in_stack_fffffffffffffe90;
  QJsonObject *in_stack_fffffffffffffe98;
  QString *in_stack_fffffffffffffea0;
  QString local_121;
  QJsonObject local_108 [8];
  QString *local_100;
  char local_f8;
  QLatin1Char local_e9 [25];
  QJsonArray local_d0 [32];
  undefined1 local_b0 [24];
  undefined1 local_98 [24];
  undefined1 local_80 [64];
  undefined1 local_40 [24];
  QString *local_28;
  char local_20;
  QString *local_18;
  char local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  iVar2 = QJsonValue::type();
  array = (QJsonArray *)(ulong)(iVar2 - 1);
  switch(array) {
  case (QJsonArray *)0x0:
    memset(local_40,0,0x18);
    QList<QString>::QList((QList<QString> *)0x2d9d44);
    uVar3 = QJsonValue::toBool(in_DIL);
    if ((uVar3 & 1) == 0) {
      QLatin1String::QLatin1String(in_stack_fffffffffffffe80,(char *)in_stack_fffffffffffffe78);
    }
    else {
      QLatin1String::QLatin1String(in_stack_fffffffffffffe80,(char *)in_stack_fffffffffffffe78);
    }
    latin1.m_data = (char *)array;
    latin1.m_size = (qsizetype)in_RSI;
    QString::QString((QString *)in_stack_fffffffffffffe80,latin1);
    QList<QString>::operator<<(in_stack_fffffffffffffe70,(rvalue_ref)in_stack_fffffffffffffe68);
    insertJsonKeyValue(in_stack_fffffffffffffe90,in_stack_fffffffffffffe88,
                       (ProValueMap *)in_stack_fffffffffffffe80);
    QString::~QString((QString *)0x2d9dd1);
    QList<QString>::~QList((QList<QString> *)0x2d9dde);
    break;
  case (QJsonArray *)0x1:
    memset(local_80,0,0x18);
    QList<QString>::QList((QList<QString> *)0x2d9e0e);
    dVar1 = (double)QJsonValue::toDouble(0.0);
    QString::number(dVar1,(char)local_98,0x67);
    QList<QString>::operator<<(in_stack_fffffffffffffe70,(rvalue_ref)in_stack_fffffffffffffe68);
    insertJsonKeyValue(in_stack_fffffffffffffe90,in_stack_fffffffffffffe88,
                       (ProValueMap *)in_stack_fffffffffffffe80);
    QString::~QString((QString *)0x2d9e66);
    QList<QString>::~QList((QList<QString> *)0x2d9e73);
    break;
  case (QJsonArray *)0x2:
    memset(local_b0,0,0x18);
    QList<QString>::QList((QList<QString> *)0x2d9ea3);
    QJsonValue::toString();
    QList<QString>::operator<<(in_stack_fffffffffffffe70,(rvalue_ref)in_stack_fffffffffffffe68);
    insertJsonKeyValue(in_RSI,in_stack_fffffffffffffe88,(ProValueMap *)in_stack_fffffffffffffe80);
    QString::~QString((QString *)0x2d9ee9);
    QList<QString>::~QList((QList<QString> *)0x2d9ef6);
    break;
  case (QJsonArray *)0x3:
    QJsonValue::toArray();
    QLatin1Char::QLatin1Char(local_e9,'.');
    QVar4 = operator+(in_stack_fffffffffffffe78,(QLatin1Char *)in_stack_fffffffffffffe70);
    local_100 = QVar4.a;
    local_f8 = (char)QVar4.b.ch;
    local_18 = local_100;
    local_10 = local_f8;
    QStringBuilder::operator_cast_to_QString(in_stack_fffffffffffffe68);
    addJsonArray(array,in_stack_fffffffffffffea0,(ProValueMap *)in_stack_fffffffffffffe98);
    QString::~QString((QString *)0x2d9fa6);
    QJsonArray::~QJsonArray(local_d0);
    break;
  case (QJsonArray *)0x4:
    QJsonValue::toObject();
    a = &local_121;
    QLatin1Char::QLatin1Char((QLatin1Char *)a,'.');
    QVar4 = operator+(a,(QLatin1Char *)in_RSI);
    local_28 = QVar4.a;
    local_20 = (char)QVar4.b.ch;
    QStringBuilder::operator_cast_to_QString(in_stack_fffffffffffffe68);
    addJsonObject(in_stack_fffffffffffffe98,in_stack_fffffffffffffe90,
                  (ProValueMap *)in_stack_fffffffffffffe88);
    QString::~QString((QString *)0x2da04b);
    QJsonObject::~QJsonObject(local_108);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

static void addJsonValue(const QJsonValue &value, const QString &keyPrefix, ProValueMap *map)
{
    switch (value.type()) {
    case QJsonValue::Bool:
        insertJsonKeyValue(keyPrefix, QStringList() << (value.toBool() ? QLatin1String("true") : QLatin1String("false")), map);
        break;
    case QJsonValue::Double:
        insertJsonKeyValue(keyPrefix, QStringList() << QString::number(value.toDouble()), map);
        break;
    case QJsonValue::String:
        insertJsonKeyValue(keyPrefix, QStringList() << value.toString(), map);
        break;
    case QJsonValue::Array:
        addJsonArray(value.toArray(), keyPrefix + QLatin1Char('.'), map);
        break;
    case QJsonValue::Object:
        addJsonObject(value.toObject(), keyPrefix + QLatin1Char('.'), map);
        break;
    default:
        break;
    }
}